

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O3

void __thiscall MppMemPoolService::put_pool(MppMemPoolService *this,MppMemPoolImpl *impl)

{
  list_head *plVar1;
  list_head *plVar2;
  pthread_mutex_t *__mutex;
  
  if ((MppMemPoolImpl *)impl->check != impl) {
    _mpp_log_l(2,"mpp_mem_pool","invalid mem impl %p check %p\n","put_pool",impl);
    return;
  }
  if (impl->finalized != 0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)&impl->lock);
  plVar2 = (impl->unused).next;
  while (plVar2 != &impl->unused) {
    plVar1 = plVar2->next;
    mpp_osal_free("put_pool",&plVar2[-1].prev);
    impl->unused_count = impl->unused_count + -1;
    plVar2 = plVar1;
  }
  if ((impl->used).next != &impl->used) {
    _mpp_log_l(2,"mpp_mem_pool","pool %s found %d used buffer size %d\n","put_pool",impl->caller,
               (ulong)(uint)impl->used_count,impl->size);
    plVar2 = (impl->used).next;
    while (plVar2 != &impl->used) {
      plVar1 = plVar2->next;
      mpp_osal_free("put_pool",&plVar2[-1].prev);
      impl->used_count = impl->used_count + -1;
      plVar2 = plVar1;
    }
  }
  if (impl->used_count != 0 || impl->unused_count != 0) {
    _mpp_log_l(2,"mpp_mem_pool","pool %s size %d found leaked buffer used:unused [%d:%d]\n",
               "put_pool",impl->caller,impl->size,(ulong)(uint)impl->used_count,
               (ulong)(uint)impl->unused_count);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&impl->lock);
  __mutex = (pthread_mutex_t *)get_lock();
  if (__mutex == (pthread_mutex_t *)0x0) {
    plVar2 = (impl->service_link).next;
    plVar1 = (impl->service_link).prev;
    plVar2->prev = plVar1;
    plVar1->next = plVar2;
    (impl->service_link).next = &impl->service_link;
    (impl->service_link).prev = &impl->service_link;
  }
  else {
    pthread_mutex_lock(__mutex);
    plVar2 = (impl->service_link).next;
    plVar1 = (impl->service_link).prev;
    plVar2->prev = plVar1;
    plVar1->next = plVar2;
    (impl->service_link).next = &impl->service_link;
    (impl->service_link).prev = &impl->service_link;
    pthread_mutex_unlock(__mutex);
  }
  impl->finalized = 1;
  mpp_osal_free("put_pool",impl);
  return;
}

Assistant:

void MppMemPoolService::put_pool(MppMemPoolImpl *impl)
{
    MppMemPoolNode *node, *m;

    if (impl != impl->check) {
        mpp_err_f("invalid mem impl %p check %p\n", impl, impl->check);
        return;
    }

    if (impl->finalized)
        return;

    pthread_mutex_lock(&impl->lock);

    if (!list_empty(&impl->unused)) {
        list_for_each_entry_safe(node, m, &impl->unused, MppMemPoolNode, list) {
            MPP_FREE(node);
            impl->unused_count--;
        }
    }

    if (!list_empty(&impl->used)) {
        mpp_err_f("pool %s found %d used buffer size %d\n",
                  impl->caller, impl->used_count, impl->size);

        list_for_each_entry_safe(node, m, &impl->used, MppMemPoolNode, list) {
            MPP_FREE(node);
            impl->used_count--;
        }
    }

    if (impl->used_count || impl->unused_count)
        mpp_err_f("pool %s size %d found leaked buffer used:unused [%d:%d]\n",
                  impl->caller, impl->size, impl->used_count, impl->unused_count);

    pthread_mutex_unlock(&impl->lock);

    {
        AutoMutex auto_lock(get_lock());
        list_del_init(&impl->service_link);
    }

    impl->finalized = 1;
    mpp_free(impl);
}